

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall soplex::CLUFactor<double>::solveLleft(CLUFactor<double> *this,double *vec)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  pointer pdVar6;
  int *piVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (0 < (long)this->thedim) {
    piVar4 = (this->l).rorig;
    piVar5 = (this->l).rbeg;
    pdVar6 = (this->l).rval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->l).ridx;
    lVar9 = (long)this->thedim;
    do {
      lVar11 = (long)piVar4[lVar9 + -1];
      dVar1 = vec[lVar11];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        iVar2 = piVar5[lVar11];
        lVar10 = (long)iVar2;
        iVar3 = piVar5[lVar11 + 1];
        if (iVar2 < iVar3) {
          do {
            iVar2 = piVar7[lVar10];
            vec[iVar2] = vec[iVar2] - pdVar6[lVar10] * dVar1;
            lVar10 = lVar10 + 1;
          } while (iVar3 != lVar10);
        }
      }
      bVar8 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar8);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleft(R* vec) const
{

#ifndef SOPLEX_WITH_L_ROWS
   int*  idx;
   R* val;
   R* lval  = l.val.data();
   int*  lidx  = l.idx;
   int*  lrow  = l.row;
   int*  lbeg  = l.start;

   for(int i = l.firstUpdate - 1; i >= 0; --i)
   {
      int k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(int j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   for(int i = thedim - 1; i >= 0; --i)
   {
      int  r = l.rorig[i];
      R x = vec[r];

      if(x != 0.0)
      {
         for(int k = l.rbeg[r]; k < l.rbeg[r + 1]; k++)
         {
            int j = l.ridx[k];

            assert(l.rperm[j] < i);

            vec[j] -= x * l.rval[k];
         }
      }
   }

#endif // SOPLEX_WITH_L_ROWS
}